

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_validate.cpp
# Opt level: O2

void __thiscall ktx::CommandValidate::executeValidate(CommandValidate *this)

{
  bool warningsAsErrors;
  bool GLTFBasisU;
  OutputFormat OVar1;
  undefined1 auVar2 [16];
  int iVar3;
  undefined8 *puVar4;
  char *pcVar5;
  bool bVar6;
  string_view filepath;
  string_view filepath_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  bool first;
  char *nl;
  char *space;
  __string_type validationMessages;
  PrintIndent out;
  char *local_5b8;
  size_type sStack_5b0;
  PrintIndent pi;
  _Any_data local_598;
  code *local_588;
  code *pcStack_580;
  _Any_data local_570;
  code *local_560;
  code *local_558;
  ostringstream messagesOS;
  InputStream inputStream;
  
  InputStream::InputStream
            (&inputStream,&(this->options).super_OptionsSingleIn.inputFilepath,
             &(this->super_Command).super_Reporter);
  OVar1 = (this->options).super_OptionsFormat.format;
  pcVar5 = (char *)(ulong)(OVar1 - json);
  if (OVar1 - json < 2) {
    bVar6 = OVar1 == json;
    space = " ";
    pcVar5 = "";
    if (!bVar6) {
      space = "";
    }
    nl = "\n";
    if (!bVar6) {
      nl = "";
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&messagesOS);
    pi.indentBase = 0;
    first = true;
    filepath._M_str = pcVar5;
    filepath._M_len = (size_t)(this->options).super_OptionsSingleIn.inputFilepath._M_dataplus._M_p;
    pi.os = (ostream *)&messagesOS;
    pi.indentWidth = (uint)bVar6 << 2;
    fmtInFile_abi_cxx11_
              (&validationMessages,
               (ktx *)(this->options).super_OptionsSingleIn.inputFilepath._M_string_length,filepath)
    ;
    warningsAsErrors = (this->options).super_OptionsValidate.warningsAsErrors;
    GLTFBasisU = (this->options).super_OptionsValidate.GLTFBasisU;
    local_588 = (code *)0x0;
    pcStack_580 = (code *)0x0;
    local_598._M_unused._M_object = (void *)0x0;
    local_598._8_8_ = 0;
    local_598._M_unused._M_object = operator_new(0x20);
    *(bool **)local_598._M_unused._0_8_ = &first;
    *(PrintIndent **)((long)local_598._M_unused._0_8_ + 8) = &pi;
    *(char ***)((long)local_598._M_unused._0_8_ + 0x10) = &nl;
    *(char ***)((long)local_598._M_unused._0_8_ + 0x18) = &space;
    pcStack_580 = std::
                  _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_validate.cpp:163:17)>
                  ::_M_invoke;
    local_588 = std::
                _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_validate.cpp:163:17)>
                ::_M_manager;
    iVar3 = validateIOStream(inputStream.activeStream,&validationMessages,warningsAsErrors,
                             GLTFBasisU,(function<void_(const_ktx::ValidationReport_&)> *)&local_598
                            );
    std::_Function_base::~_Function_base((_Function_base *)&local_598);
    std::__cxx11::string::~string((string *)&validationMessages);
    out.os = (ostream *)&std::cout;
    out.indentBase = 0;
    out.indentWidth = (uint)bVar6 << 2;
    PrintIndent::operator()(&out,0,(char (*) [5])0x1cef39,&nl);
    PrintIndent::operator()
              (&out,1,(char (*) [65])
                      "\"$schema\":{}\"https://schema.khronos.org/ktx/validate_v0.json\",{}",&space,
               &nl);
    validationMessages._M_dataplus._M_p._0_1_ = iVar3 == 0;
    PrintIndent::operator()
              (&out,1,(char (*) [16])"\"valid\":{}{},{}",&space,(bool *)&validationMessages,&nl);
    if (first == false) {
      PrintIndent::operator()(&out,1,(char (*) [17])"\"messages\":{}[{}",&space,&nl);
      std::__cxx11::stringbuf::str();
      local_5b8 = (char *)CONCAT71(validationMessages._M_dataplus._M_p._1_7_,
                                   validationMessages._M_dataplus._M_p._0_1_);
      sStack_5b0 = validationMessages._M_string_length;
      args_01.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_5b8;
      args_01.desc_ = 0xd;
      fmt_02.size_ = 2;
      fmt_02.data_ = "{}";
      ::fmt::v10::vprint(fmt_02,args_01);
      std::__cxx11::string::~string((string *)&validationMessages);
      PrintIndent::operator()(&out,2,(char (*) [5])0x1cdd65,&nl);
      PrintIndent::operator()(&out,1,(char (*) [4])0x1e1d0c,&nl);
    }
    else {
      PrintIndent::operator()(&out,1,(char (*) [18])"\"messages\":{}[]{}",&space,&nl);
    }
    PrintIndent::operator()(&out,0,(char (*) [5])0x1cdd65,&nl);
    if (iVar3 != 0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = &PTR__exception_00240758;
      *(undefined4 *)(puVar4 + 1) = 3;
      __cxa_throw(puVar4,&FatalError::typeinfo,std::exception::~exception);
    }
  }
  else {
    if (OVar1 != text) goto LAB_00185ac1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&messagesOS);
    filepath_00._M_str = pcVar5;
    filepath_00._M_len =
         (size_t)(this->options).super_OptionsSingleIn.inputFilepath._M_dataplus._M_p;
    fmtInFile_abi_cxx11_
              (&validationMessages,
               (ktx *)(this->options).super_OptionsSingleIn.inputFilepath._M_string_length,
               filepath_00);
    local_570._8_8_ = 0;
    local_558 = std::
                _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_validate.cpp:131:17)>
                ::_M_invoke;
    local_560 = std::
                _Function_handler<void_(const_ktx::ValidationReport_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_validate.cpp:131:17)>
                ::_M_manager;
    local_570._M_unused._0_8_ = (undefined8)(ostringstream *)&messagesOS;
    iVar3 = validateIOStream(inputStream.activeStream,&validationMessages,
                             (this->options).super_OptionsValidate.warningsAsErrors,
                             (this->options).super_OptionsValidate.GLTFBasisU,
                             (function<void_(const_ktx::ValidationReport_&)> *)&local_570);
    std::_Function_base::~_Function_base((_Function_base *)&local_570);
    std::__cxx11::string::~string((string *)&validationMessages);
    std::__cxx11::stringbuf::str();
    if (validationMessages._M_string_length != 0) {
      local_5b8 = "failed";
      if (iVar3 == 0) {
        local_5b8 = "successful";
      }
      args.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_5b8;
      args.desc_ = 0xc;
      fmt.size_ = 0xe;
      fmt.data_ = "Validation {}\n";
      ::fmt::v10::vprint(fmt,args);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = &local_5b8;
      fmt_00.size_ = 1;
      fmt_00.data_ = "\n";
      ::fmt::v10::vprint(fmt_00,(format_args)(auVar2 << 0x40));
      local_5b8 = (char *)CONCAT71(validationMessages._M_dataplus._M_p._1_7_,
                                   validationMessages._M_dataplus._M_p._0_1_);
      sStack_5b0 = validationMessages._M_string_length;
      args_00.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_5b8;
      args_00.desc_ = 0xd;
      fmt_01.size_ = 2;
      fmt_01.data_ = "{}";
      ::fmt::v10::vprint(fmt_01,args_00);
    }
    if (iVar3 != 0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar4 = &PTR__exception_00240758;
      *(undefined4 *)(puVar4 + 1) = 3;
      __cxa_throw(puVar4,&FatalError::typeinfo,std::exception::~exception);
    }
    std::__cxx11::string::~string((string *)&validationMessages);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&messagesOS);
LAB_00185ac1:
  InputStream::~InputStream(&inputStream);
  return;
}

Assistant:

void CommandValidate::executeValidate() {
    InputStream inputStream(options.inputFilepath, *this);

    switch (options.format) {
    case OutputFormat::text: {
        std::ostringstream messagesOS;
        const auto validationResult = validateIOStream(
                inputStream,
                fmtInFile(options.inputFilepath),
                options.warningsAsErrors,
                options.GLTFBasisU,
                [&](const ValidationReport& issue) {
            fmt::print(messagesOS, "{}-{:04}: {}\n", toString(issue.type), issue.id, issue.message);
            fmt::print(messagesOS, "    {}\n", issue.details);
        });

        const auto validationMessages = std::move(messagesOS).str();
        if (!validationMessages.empty()) {
            fmt::print("Validation {}\n", validationResult == 0 ? "successful" : "failed");
            fmt::print("\n");
            fmt::print("{}", validationMessages);
        }

        if (validationResult != 0)
            throw FatalError(rc::INVALID_FILE);
        break;
    }
    case OutputFormat::json: [[fallthrough]];
    case OutputFormat::json_mini: {
        const auto base_indent = options.format == OutputFormat::json ? +0 : 0;
        const auto indent_width = options.format == OutputFormat::json ? 4 : 0;
        const auto space = options.format == OutputFormat::json ? " " : "";
        const auto nl = options.format == OutputFormat::json ? "\n" : "";

        std::ostringstream messagesOS;
        PrintIndent pi{messagesOS, base_indent, indent_width};

        bool first = true;
        const auto validationResult = validateIOStream(
                inputStream,
                fmtInFile(options.inputFilepath),
                options.warningsAsErrors,
                options.GLTFBasisU,
                [&](const ValidationReport& issue) {
            if (!std::exchange(first, false)) {
                pi(2, "}},{}", nl);
            }
            pi(2, "{{{}", nl);
            pi(3, "\"id\":{}{},{}", space, issue.id, nl);
            pi(3, "\"type\":{}\"{}\",{}", space, toString(issue.type), nl);
            pi(3, "\"message\":{}\"{}\",{}", space, escape_json_copy(issue.message), nl);
            pi(3, "\"details\":{}\"{}\"{}", space, escape_json_copy(issue.details), nl);
        });

        PrintIndent out{std::cout, base_indent, indent_width};
        out(0, "{{{}", nl);
        out(1, "\"$schema\":{}\"https://schema.khronos.org/ktx/validate_v0.json\",{}", space, nl);
        out(1, "\"valid\":{}{},{}", space, validationResult == 0, nl);
        if (!first) {
            out(1, "\"messages\":{}[{}", space, nl);
            fmt::print("{}", std::move(messagesOS).str());
            out(2, "}}{}", nl);
            out(1, "]{}", nl);
        } else {
            out(1, "\"messages\":{}[]{}", space, nl);
        }
        out(0, "}}{}", nl);

        if (validationResult != 0)
            throw FatalError(rc::INVALID_FILE);
        break;
    }
    }
}